

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Deserializer::StructQueueReadChecks
          (BP5Deserializer *this,VariableStruct *variable,BP5VarRec *VarRec)

{
  long in_RDX;
  long in_RSI;
  StructDefinition *EngineReadDef;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_180 [16];
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  string *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  allocator local_139;
  string local_138 [39];
  undefined1 local_111 [40];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = *(long *)(in_RDX + 0x60);
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(long *)(in_RSI + 0x248) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Toolkit",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"format::BP5Deserializer",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"QueueGet",&local_a1);
    std::operator+((char *)in_stack_fffffffffffffe98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    helper::Throw<std::logic_error>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  if (*(long *)(local_10 + 0x248) != local_20) {
    if (local_20 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"Toolkit",&local_e9);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_111;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_111 + 1),"format::BP5Deserializer",(allocator *)__lhs);
      __rhs = &local_139;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"QueueGet",__rhs);
      std::operator+((char *)in_stack_fffffffffffffe98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      std::operator+(__lhs,(char *)__rhs);
      helper::Throw<std::logic_error>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      std::__cxx11::string::~string((string *)(local_111 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_111);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    *(undefined8 *)(local_18 + 0x60) = *(undefined8 *)(local_10 + 0x248);
  }
  return;
}

Assistant:

void BP5Deserializer::StructQueueReadChecks(core::VariableStruct *variable, BP5VarRec *VarRec)
{
    auto EngineReadDef = VarRec->ReaderDef;
    // If there is no ReadDefinition, that's an error
    if (!variable->m_ReadStructDefinition)
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Deserializer", "QueueGet",
                                        "ReadStructure not defined for variable " +
                                            variable->m_Name);

    // If there was a prior read def and the current is the same, that's fine
    if (variable->m_ReadStructDefinition == EngineReadDef)
        return;

    // If there was a prior read definition and this one is different, throw
    if (EngineReadDef)
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Deserializer", "QueueGet",
                                        "ReadStructure definition for variable " +
                                            variable->m_Name +
                                            " changed from prior definition.  Unsupported.");

    // Check to see if the read definition is compatible with the write
    // definition (and the engine can support the transformation)

    // OK, use this
    VarRec->ReaderDef = variable->m_ReadStructDefinition;
}